

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TimeLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TimeLiteral,slang::ast::Type_const&,double&,slang::SourceRange>
          (BumpAllocator *this,Type *args,double *args_1,SourceRange *args_2)

{
  double dVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  TimeLiteral *pTVar4;
  
  pTVar4 = (TimeLiteral *)allocate(this,0x38,8);
  dVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pTVar4->super_Expression).kind = TimeLiteral;
  (pTVar4->super_Expression).type.ptr = args;
  (pTVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pTVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pTVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pTVar4->super_Expression).sourceRange.endLoc = SVar3;
  pTVar4->value = dVar1;
  return pTVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }